

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O1

char * flatcc_json_parser_array_end(flatcc_json_parser_t *ctx,char *buf,char *end,int *more)

{
  char *pcVar1;
  
  if ((long)end - (long)buf < 2) {
LAB_001253bb:
    buf = flatcc_json_parser_space_ext(ctx,buf,end);
  }
  else if (*buf < '!') {
    if ((*buf != ' ') || (buf[1] < '!')) goto LAB_001253bb;
    buf = buf + 1;
  }
  if (buf == end) {
    *more = 0;
    return buf;
  }
  if (*buf == ',') {
    pcVar1 = buf + 1;
    if ((long)end - (long)pcVar1 < 2) {
LAB_00125415:
      pcVar1 = flatcc_json_parser_space_ext(ctx,pcVar1,end);
    }
    else if (*pcVar1 < '!') {
      if ((*pcVar1 != ' ') || (buf[2] < '!')) goto LAB_00125415;
      pcVar1 = buf + 2;
    }
    buf = pcVar1;
    if (pcVar1 == end) {
      *more = 0;
LAB_00125452:
      if (ctx->error != 0) {
        return end;
      }
      ctx->error = 9;
      ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
      ctx->error_loc = buf;
      return end;
    }
    if (*pcVar1 != ']') {
      *more = 1;
      return pcVar1;
    }
    *more = 0;
  }
  else {
    *more = 0;
    if (*buf != ']') goto LAB_00125452;
  }
  pcVar1 = buf + 1;
  if (1 < (long)end - (long)pcVar1) {
    if (*pcVar1 < '!') {
      if ((*pcVar1 != ' ') || (buf[2] < '!')) goto LAB_00125493;
      pcVar1 = buf + 2;
    }
    return pcVar1;
  }
LAB_00125493:
  pcVar1 = flatcc_json_parser_space_ext(ctx,pcVar1,end);
  return pcVar1;
}

Assistant:

static inline const char *flatcc_json_parser_array_end(flatcc_json_parser_t *ctx, const char *buf,
        const char *end, int *more)
{
    buf = flatcc_json_parser_space(ctx, buf, end);
    if (buf == end) {
        *more = 0;
        return buf;
    }
    if (*buf != ',') {
        *more = 0;
        if (*buf != ']') {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unbalanced_array);
        } else {
            return flatcc_json_parser_space(ctx, buf + 1, end);
        }
    }
    buf = flatcc_json_parser_space(ctx, buf + 1, end);
    if (buf == end) {
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unbalanced_array);
    }
#if FLATCC_JSON_PARSE_ALLOW_TRAILING_COMMA
    if (*buf == ']') {
        *more = 0;
        return flatcc_json_parser_space(ctx, buf + 1, end);
    }
#endif
    *more = 1;
    return buf;
}